

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_shared_ptr.cpp
# Opt level: O2

int main(void)

{
  element_type *peVar1;
  element_type *peVar2;
  int *__p;
  foo *pfVar3;
  bar *__p_00;
  bee *__p_01;
  counted *pcVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  undefined8 local_2a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_2a0 [3];
  shared_ptr<counted> cnt;
  shared_ptr<counted> cnt2;
  weak_ptr<int> wp;
  shared_ptr<int> p;
  shared_ptr<foo> f;
  ostringstream oss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228 [46];
  shared_ptr<int> p3;
  shared_ptr<int> p2;
  shared_ptr<bee> bee1;
  shared_ptr<bar> b;
  shared_ptr<counted> cnt3;
  weak_ptr<counted> wpcnt;
  shared_ptr<bee> bee2;
  shared_ptr<int> p4;
  runtime_error local_38 [16];
  
  __p = (int *)operator_new(4);
  *__p = 10;
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&p,__p);
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&p2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>,
             &p.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>);
  if (*p2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != 10) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x48);
    std::operator<<(poVar5," *p2==10");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((p2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((p2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count != 2)
     ) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x49);
    std::operator<<(poVar5," p2.use_count() == 2");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *p2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0x14;
  if (*p.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != 0x14) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4b);
    std::operator<<(poVar5," *p==20");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__weak_ptr<int,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<int,void>
            ((__weak_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&wp,
             &p.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>);
  if ((p.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((p.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count != 2))
  {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4d);
    std::operator<<(poVar5," p.use_count() == 2");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&p3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>,&wp);
  if (p3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4f);
    std::operator<<(poVar5," p3");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((p3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((p3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count != 3)
     ) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x50);
    std::operator<<(poVar5," p3.use_count() == 3");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*p2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != 0x14) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x51);
    std::operator<<(poVar5," *p2==20");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((wp.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((wp.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count == 0))
  {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x52);
    std::operator<<(poVar5," !wp.expired()");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (p.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x53);
    std::operator<<(poVar5," p");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::reset
            (&p.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::reset
            (&p2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>);
  if (p.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x57);
    std::operator<<(poVar5," !p");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((p3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((p3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count != 1)
     ) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x58);
    std::operator<<(poVar5," p3.use_count() == 1");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::reset
            (&p3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>);
  if (p3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5a);
    std::operator<<(poVar5," !p3");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((wp.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     ((wp.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count != 0))
  {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5b);
    std::operator<<(poVar5," wp.expired()");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&p4.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>,&wp);
  if (p4.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5d);
    std::operator<<(poVar5," !p4");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&oss,
             &wp.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>);
  std::runtime_error::runtime_error(local_38,"Should not get there");
  std::runtime_error::~runtime_error(local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_228);
  pfVar3 = (foo *)operator_new(8);
  pfVar3->_vptr_foo = (_func_int **)&PTR__foo_00109b10;
  std::__shared_ptr<foo,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<foo,void>
            ((__shared_ptr<foo,(__gnu_cxx::_Lock_policy)2> *)&f,pfVar3);
  __p_00 = (bar *)operator_new(8);
  (__p_00->super_foo)._vptr_foo = (_func_int **)&PTR__foo_00109b40;
  std::__shared_ptr<bar,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<bar,void>
            ((__shared_ptr<bar,(__gnu_cxx::_Lock_policy)2> *)&b,__p_00);
  std::__shared_ptr<foo,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<foo,(__gnu_cxx::_Lock_policy)2> *)&f,
             &b.super___shared_ptr<bar,_(__gnu_cxx::_Lock_policy)2>);
  std::dynamic_pointer_cast<bar,foo>((shared_ptr<foo> *)&oss);
  peVar2 = b.super___shared_ptr<bar,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1 = _oss;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_228);
  if (peVar1 != (element_type *)peVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x68);
    std::operator<<(poVar5," booster::dynamic_pointer_cast<bar>(f)==b");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::static_pointer_cast<bar,foo>((shared_ptr<foo> *)&oss);
  peVar1 = _oss;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_228);
  if (peVar1 != (element_type *)b.super___shared_ptr<bar,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x69);
    std::operator<<(poVar5," booster::static_pointer_cast<bar>(f)==b");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pfVar3 = (foo *)operator_new(8);
  pfVar3->_vptr_foo = (_func_int **)&PTR__foo_00109b10;
  std::__shared_ptr<foo,_(__gnu_cxx::_Lock_policy)2>::reset<foo>
            (&f.super___shared_ptr<foo,_(__gnu_cxx::_Lock_policy)2>,pfVar3);
  std::dynamic_pointer_cast<bar,foo>((shared_ptr<foo> *)&oss);
  peVar1 = _oss;
  local_2a8 = 0;
  a_Stack_2a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_2a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_228);
  if (peVar1 != (element_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6b);
    std::operator<<(poVar5," booster::dynamic_pointer_cast<bar>(f)==booster::shared_ptr<bar>()");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __p_01 = (bee *)operator_new(0x10);
  (__p_01->super_enable_shared_from_this<bee>)._M_weak_this.
  super___weak_ptr<bee,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__p_01->super_enable_shared_from_this<bee>)._M_weak_this.
  super___weak_ptr<bee,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<bee,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<bee,void>
            ((__shared_ptr<bee,(__gnu_cxx::_Lock_policy)2> *)&bee1,__p_01);
  std::__shared_ptr<bee,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<bee,void>
            ((__shared_ptr<bee,(__gnu_cxx::_Lock_policy)2> *)&bee2,
             (__weak_ptr<bee,_(__gnu_cxx::_Lock_policy)2> *)
             bee1.super___shared_ptr<bee,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (bee1.super___shared_ptr<bee,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      bee2.super___shared_ptr<bee,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6f);
    std::operator<<(poVar5," bee1==bee2");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cnt.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  cnt.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (counted::counter != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x72);
    std::operator<<(poVar5," counted::counter==0");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar4 = (counted *)operator_new(1);
  counted::counter = 1;
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset<counted>
            (&cnt.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>,pcVar4);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x74);
    std::operator<<(poVar5," counted::counter==1");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset
            (&cnt.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>);
  if (counted::counter != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x76);
    std::operator<<(poVar5," counted::counter==0");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar4 = (counted *)operator_new(1);
  counted::counter = 1;
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset<counted>
            (&cnt.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>,pcVar4);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x78);
    std::operator<<(poVar5," counted::counter==1");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&cnt2.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>,
             &cnt.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7a);
    std::operator<<(poVar5," counted::counter==1");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar4 = (counted *)operator_new(1);
  counted::counter = 2;
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset<counted>
            (&cnt.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>,pcVar4);
  if (counted::counter != 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7c);
    std::operator<<(poVar5," counted::counter==2");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&cnt.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>,
             &cnt.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&cnt2.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>,
             &cnt2.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>);
  if (counted::counter != 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7f);
    std::operator<<(poVar5," counted::counter==2");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&cnt.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>,
             &cnt2.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x81);
    std::operator<<(poVar5," counted::counter==1");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&cnt2.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>,
             &cnt.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x83);
    std::operator<<(poVar5," counted::counter==1");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__weak_ptr<counted,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<counted,void>
            ((__weak_ptr<counted,(__gnu_cxx::_Lock_policy)2> *)&wpcnt,
             &cnt2.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&cnt3.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>,
             (__weak_ptr<counted,(__gnu_cxx::_Lock_policy)2> *)&wpcnt);
  if (cnt3.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x86);
    std::operator<<(poVar5," cnt3");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x87);
    std::operator<<(poVar5," counted::counter==1");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset
            (&cnt3.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x89);
    std::operator<<(poVar5," counted::counter==1");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset
            (&cnt2.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8b);
    std::operator<<(poVar5," counted::counter==1");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset
            (&cnt.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>);
  if (counted::counter != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8d);
    std::operator<<(poVar5," counted::counter==0");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2> *)&oss,&wpcnt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_228);
  if (_oss == (element_type *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cnt3.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&wpcnt.super___weak_ptr<counted,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cnt2.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cnt.super___shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&bee2.super___shared_ptr<bee,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&bee1.super___shared_ptr<bee,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&b.super___shared_ptr<bar,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&f.super___shared_ptr<foo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p4.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&wp.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    poVar5 = std::operator<<((ostream *)&std::cout,"Ok");
    std::endl<char,std::char_traits<char>>(poVar5);
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar5 = std::operator<<((ostream *)&oss,"Error ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8e);
  std::operator<<(poVar5," !wpcnt.lock()");
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(string *)&local_2a8);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		booster::shared_ptr<int> p(new int(10));
		booster::shared_ptr<int> p2=p;
		TEST(*p2==10);
		TEST(p2.use_count() == 2);
		*p2=20;
		TEST(*p==20);
		booster::weak_ptr<int> wp=p;
		TEST(p.use_count() == 2);
		booster::shared_ptr<int> p3=wp.lock();
		TEST(p3);
		TEST(p3.use_count() == 3);
		TEST(*p2==20);
		TEST(!wp.expired());
		TEST(p);
		TEST(!!p);
		p.reset();
		p2.reset();
		TEST(!p);
		TEST(p3.use_count() == 1);
		p3.reset();
		TEST(!p3);
		TEST(wp.expired());
		booster::shared_ptr<int> p4=wp.lock();
		TEST(!p4);

		try {
			booster::shared_ptr<int> p4(wp);
			std::runtime_error("Should not get there");
		}
		catch(booster::bad_weak_ptr const &e){}

		booster::shared_ptr<foo> f(new foo);
		booster::shared_ptr<bar> b(new bar);
		f=b;
		TEST(booster::dynamic_pointer_cast<bar>(f)==b);
		TEST(booster::static_pointer_cast<bar>(f)==b);
		f.reset(new foo);
		TEST(booster::dynamic_pointer_cast<bar>(f)==booster::shared_ptr<bar>());

		booster::shared_ptr<bee> bee1(new bee);
		booster::shared_ptr<bee> bee2=bee1->self();
		TEST(bee1==bee2);

		booster::shared_ptr<counted> cnt;
		TEST(counted::counter==0);
		cnt.reset(new counted);
		TEST(counted::counter==1);
		cnt.reset();
		TEST(counted::counter==0);
		cnt.reset(new counted);
		TEST(counted::counter==1);
		booster::shared_ptr<counted> cnt2(cnt);
		TEST(counted::counter==1);
		cnt.reset(new counted);
		TEST(counted::counter==2);
		cnt=cnt;
		cnt2=cnt2;
		TEST(counted::counter==2);
		cnt=cnt2;
		TEST(counted::counter==1);
		cnt2=cnt;
		TEST(counted::counter==1);
		booster::weak_ptr<counted> wpcnt(cnt2);
		booster::shared_ptr<counted> cnt3=wpcnt.lock();
		TEST(cnt3);
		TEST(counted::counter==1);
		cnt3.reset();
		TEST(counted::counter==1);
		cnt2.reset();
		TEST(counted::counter==1);
		cnt.reset();
		TEST(counted::counter==0);
		TEST(!wpcnt.lock());

	}
	catch(std::exception const &e) {
		std::cerr << "Fail:" << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;	
}